

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::BasicAtomicCase3::GenSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,uvec3 *param_1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198;
  uvec3 *local_20;
  uvec3 *local_size_local;
  BasicAtomicCase3 *this_local;
  
  local_20 = param_1;
  local_size_local = (uvec3 *)this;
  this_local = (BasicAtomicCase3 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar4 = std::operator<<(&local_198,"\nlayout(local_size_x = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::x(local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,", local_size_y = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::y(local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,", local_size_z = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::z(local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,
                           ") in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_uint_out[")
  ;
  uVar1 = tcu::Vector<unsigned_int,_3>::x(local_20);
  uVar2 = tcu::Vector<unsigned_int,_3>::y(local_20);
  uVar3 = tcu::Vector<unsigned_int,_3>::z(local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 * uVar2 * uVar3);
  poVar4 = std::operator<<(poVar4,"];\n  int g_int_out[");
  uVar1 = tcu::Vector<unsigned_int,_3>::x(local_20);
  uVar2 = tcu::Vector<unsigned_int,_3>::y(local_20);
  uVar3 = tcu::Vector<unsigned_int,_3>::z(local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 * uVar2 * uVar3);
  poVar4 = std::operator<<(poVar4,"];\n};\nshared uint g_shared_uint[");
  uVar1 = tcu::Vector<unsigned_int,_3>::x(local_20);
  uVar2 = tcu::Vector<unsigned_int,_3>::y(local_20);
  uVar3 = tcu::Vector<unsigned_int,_3>::z(local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 * uVar2 * uVar3);
  poVar4 = std::operator<<(poVar4,"];\nshared int g_shared_int[");
  uVar1 = tcu::Vector<unsigned_int,_3>::x(local_20);
  uVar2 = tcu::Vector<unsigned_int,_3>::y(local_20);
  uVar3 = tcu::Vector<unsigned_int,_3>::z(local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 * uVar2 * uVar3);
  std::operator<<(poVar4,
                  "];\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  atomicExchange(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[0]);\n  atomicMin(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[1]);\n  atomicMax(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[2]);\n  atomicAnd(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[3]);\n  atomicOr(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[4]);\n  atomicXor(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[5]);\n  atomicCompSwap(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]);\n\n  atomicExchange(g_shared_int[gl_LocalInvocationIndex], 3);\n  atomicMin(g_shared_int[gl_LocalInvocationIndex], 1);\n  atomicMax(g_shared_int[gl_LocalInvocationIndex], 2);\n  atomicAnd(g_shared_int[gl_LocalInvocationIndex], 0x1);\n  if (g_uint_value[1] > 0u) {\n    atomicOr(g_shared_int[gl_LocalInvocationIndex], 0x3);\n    atomicXor(g_shared_int[gl_LocalInvocationIndex], 0x1);\n    atomicCompSwap(g_shared_int[gl_LocalInvocationIndex], 0x2, 0x7);\n  }\n\n  g_uint_out[gl_LocalInvocationIndex] = g_shared_uint[gl_LocalInvocationIndex];\n  g_int_out[gl_LocalInvocationIndex] = g_shared_int[gl_LocalInvocationIndex];\n}"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GenSource(const uvec3& local_size)
	{
		std::stringstream ss;
		ss << NL "layout(local_size_x = " << local_size.x() << ", local_size_y = " << local_size.y()
		   << ", local_size_z = " << local_size.z()
		   << ") in;" NL "layout(std430, binding = 0) buffer Output {" NL "  uint g_uint_out["
		   << local_size.x() * local_size.y() * local_size.z() << "];" NL "  int g_int_out["
		   << local_size.x() * local_size.y() * local_size.z() << "];" NL "};" NL "shared uint g_shared_uint["
		   << local_size.x() * local_size.y() * local_size.z() << "];" NL "shared int g_shared_int["
		   << local_size.x() * local_size.y() * local_size.z()
		   << "];" NL "uniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);" NL
			  "void main() {" NL "  atomicExchange(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[0]);" NL
			  "  atomicMin(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[1]);" NL
			  "  atomicMax(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[2]);" NL
			  "  atomicAnd(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[3]);" NL
			  "  atomicOr(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[4]);" NL
			  "  atomicXor(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[5]);" NL
			  "  atomicCompSwap(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]);" NL NL
			  "  atomicExchange(g_shared_int[gl_LocalInvocationIndex], 3);" NL
			  "  atomicMin(g_shared_int[gl_LocalInvocationIndex], 1);" NL
			  "  atomicMax(g_shared_int[gl_LocalInvocationIndex], 2);" NL
			  "  atomicAnd(g_shared_int[gl_LocalInvocationIndex], 0x1);" NL "  if (g_uint_value[1] > 0u) {" NL
			  "    atomicOr(g_shared_int[gl_LocalInvocationIndex], 0x3);" NL
			  "    atomicXor(g_shared_int[gl_LocalInvocationIndex], 0x1);" NL
			  "    atomicCompSwap(g_shared_int[gl_LocalInvocationIndex], 0x2, 0x7);" NL "  }" NL NL
			  "  g_uint_out[gl_LocalInvocationIndex] = g_shared_uint[gl_LocalInvocationIndex];" NL
			  "  g_int_out[gl_LocalInvocationIndex] = g_shared_int[gl_LocalInvocationIndex];" NL "}";
		return ss.str();
	}